

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::UdpEntrySyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,UdpEntrySyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (UdpEntrySyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 2;
    break;
  case (UdpEntrySyntax *)0x1:
    return __return_storage_ptr__ + 5;
  case (UdpEntrySyntax *)0x2:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[6].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (UdpEntrySyntax *)0x3:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[6].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (UdpEntrySyntax *)0x4:
    pPVar1 = *(PtrTokenOrSyntax **)
              ((long)&__return_storage_ptr__[7].
                      super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .
                      super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                      .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                      super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
              + 8);
    break;
  case (UdpEntrySyntax *)0x5:
    return (PtrTokenOrSyntax *)(__index_type *)(__return_storage_ptr__ + 8);
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax UdpEntrySyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &inputs;
        case 1: return &colon1;
        case 2: return current;
        case 3: return &colon2;
        case 4: return next;
        case 5: return &semi;
        default: return nullptr;
    }
}